

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PrimitivePortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation_const&,slang::ast::PrimitivePortDirection&>
          (BumpAllocator *this,Compilation *args,char (*args_1) [1],SourceLocation *args_2,
          PrimitivePortDirection *args_3)

{
  string_view name;
  PrimitivePortSymbol *__str;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  PrimitivePortSymbol *in_R8;
  size_t in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  PrimitivePortDirection in_stack_ffffffffffffffcc;
  Compilation *in_stack_ffffffffffffffd0;
  
  __str = (PrimitivePortSymbol *)
          allocate((BumpAllocator *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,(char *)__str);
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  ast::PrimitivePortSymbol::PrimitivePortSymbol
            (in_R8,in_stack_ffffffffffffffd0,name,in_RCX,in_stack_ffffffffffffffcc);
  return __str;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }